

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl.c
# Opt level: O1

void * chck_dl_load(char *file,char **out_error)

{
  void *pvVar1;
  char *pcVar2;
  
  if (file != (char *)0x0) {
    pvVar1 = (void *)dlopen(file,2);
    if (pvVar1 == (void *)0x0) {
      pcVar2 = (char *)dlerror();
    }
    else {
      pcVar2 = (char *)0x0;
    }
    if (out_error != (char **)0x0) {
      *out_error = pcVar2;
    }
    return pvVar1;
  }
  __assert_fail("file",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/dl/dl.c",0x12
                ,"void *chck_dl_load(const char *, const char **)");
}

Assistant:

void*
chck_dl_load(const char *file, const char **out_error)
{
   assert(file);

   void *handle = NULL;
   const char *error = NULL;
#if defined(_WIN32) || defined(_WIN64)
#if defined(__WINRT__)
   /**
    * WinRT only publically supports LoadPackagedLibrary() for loading .dll
    * files. LoadLibrary() is a private API, and not available for apps
    * (that can be published to MS' Windows Store.)
    */
   handle = (void*)LoadPackagedLibrary(file, 0);
#else
   handle = (void*)LoadLibrary(file);
#endif

   if (!handle)
      error = "Failed to load dll file.";
#elif defined(__posix__) || defined(__unix__) || defined(__linux__) || defined(__APPLE__)
   if (!(handle = dlopen(file, RTLD_NOW | RTLD_LOCAL)))
      error = dlerror();
#else
   error = "cdl: unsupported os";
#endif

   if (out_error)
      *out_error = error;

   return handle;
}